

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O1

bool __thiscall BasePort::ScanNodes(BasePort *this)

{
  ostream *poVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  ostream oVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ostream *poVar10;
  long lVar11;
  ulong uVar12;
  long *plVar13;
  uchar *puVar14;
  char *pcVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  quadlet_t data;
  uint32_t git_desc;
  uint local_94;
  uint local_90;
  short local_8a;
  undefined8 local_88;
  ulong local_80;
  uchar *local_78;
  string local_70;
  string local_50;
  
  local_78 = this->Node2Board;
  builtin_memcpy(this->Node2Board,
                 "\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10"
                 ,0x40);
  this->IsAllBoardsBroadcastCapable_ = true;
  this->IsAllBoardsRev4_5_ = true;
  this->IsAllBoardsRev4_6_ = true;
  this->IsAllBoardsRev6_ = true;
  this->IsAllBoardsRev7_ = true;
  this->IsAllBoardsRev8_9_ = true;
  this->NumOfNodes_ = 0;
  uVar6 = (*this->_vptr_BasePort[2])();
  poVar10 = this->outStr;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,"BasePort::ScanNodes: building node map for ",0x2b);
  local_8a = (short)uVar6;
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," nodes:",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  if ((short)uVar6 != 0) {
    uVar18 = 0;
    do {
      iVar7 = (*this->_vptr_BasePort[4])(this,uVar18 & 0xffff,4,&local_94,0);
      if ((char)iVar7 == '\0') {
        iVar7 = (*this->_vptr_BasePort[0xf])(this);
        if (iVar7 == 0) {
          poVar10 = this->outStr;
          lVar11 = 0x2e;
          pcVar15 = "BasePort::ScanNodes: unable to read from node ";
LAB_0010bb1c:
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar15,lVar11);
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          lVar11 = *(long *)poVar10;
          goto LAB_0010bb32;
        }
      }
      else {
        uVar17 = (ulong)local_94;
        lVar11 = (long)SupportedHardware.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)SupportedHardware.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
        bVar19 = lVar11 != 0;
        if (lVar11 == 0) {
LAB_0010b7be:
          if (bVar19) goto LAB_0010b7c6;
          poVar10 = this->outStr;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,"BasePort::ScanNodes: node ",0x1a);
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10," is not a supported board (data = ",0x22);
          *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) =
               *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) & 0xffffffb5 | 8;
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) =
               *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) & 0xffffffb5 | 2;
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
          lVar11 = *(long *)poVar10;
LAB_0010bb32:
          std::ios::widen((char)*(undefined8 *)(lVar11 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
        }
        else {
          uVar12 = lVar11 >> 3;
          if (*SupportedHardware.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start != uVar17) {
            uVar4 = 1;
            do {
              uVar16 = uVar4;
              if (uVar12 + (uVar12 == 0) == uVar16) break;
              uVar4 = uVar16 + 1;
            } while (SupportedHardware.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar16] != uVar17);
            bVar19 = uVar16 < uVar12;
            goto LAB_0010b7be;
          }
LAB_0010b7c6:
          iVar7 = (*this->_vptr_BasePort[4])(this,uVar18 & 0xffff,7,&local_94);
          uVar3 = local_94;
          if ((char)iVar7 == '\0') {
            poVar10 = this->outStr;
            lVar11 = 0x3f;
            pcVar15 = "BasePort::ScanNodes: unable to read firmware version from node ";
            goto LAB_0010bb1c;
          }
          uVar12 = (ulong)local_94;
          uVar8 = 1;
          if (uVar12 < 5) {
LAB_0010b823:
            iVar7 = (*this->_vptr_BasePort[4])(this,uVar18 & 0xffff,0,&local_94);
            if ((char)iVar7 != '\0') {
              uVar9 = local_94 >> 0x18 & 0xf;
              local_80 = (ulong)uVar9;
              local_88 = (ulong)uVar9;
              this->FpgaVersion[local_88] = uVar8;
              this->HardwareVersion[local_88] = uVar17;
              this->FirmwareVersion[local_88] = uVar12;
              local_90 = 0;
              iVar7 = (*this->_vptr_BasePort[4])(this,uVar18 & 0xffff,0xf,&local_90);
              if ((char)iVar7 == '\0') {
                poVar10 = this->outStr;
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,"BasePort::ScanNodes: unable to read git desc from node ",0x37);
                poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
              }
              poVar10 = this->outStr;
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  Node ",7);
              poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,", BoardId = ",0xc);
              uVar17 = local_80;
              poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
              GetFpgaVersionMajorString_abi_cxx11_(&local_50,this,(uchar)uVar17);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,local_50._M_dataplus._M_p,local_50._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,", Hardware = ",0xd);
              GetHardwareVersionString_abi_cxx11_(&local_70,this,(uchar)local_80);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,local_70._M_dataplus._M_p,local_70._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,", Firmware Version = ",0x15);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_90 != 0) {
                pcVar15 = "-";
                if ((local_90 & 3) != 1) {
                  if ((local_90 & 3) == 0) {
                    pcVar15 = "+";
                    if ((local_90 >> 2 & 1) == 0 && (local_90 & 8) == 0) goto LAB_0010bca4;
                  }
                  else {
                    pcVar15 = "?";
                  }
                }
                local_88 = CONCAT44(local_88._4_4_,local_90) & 0xffffffff00000008;
                std::__ostream_insert<char,std::char_traits<char>>(this->outStr,pcVar15,1);
                poVar1 = this->outStr;
                std::__ostream_insert<char,std::char_traits<char>>(poVar1," (git-",6);
                lVar11 = *(long *)poVar1;
                *(uint *)(poVar1 + *(long *)(lVar11 + -0x18) + 0x18) =
                     *(uint *)(poVar1 + *(long *)(lVar11 + -0x18) + 0x18) & 0xffffffb5 | 8;
                *(undefined8 *)(poVar1 + *(long *)(lVar11 + -0x18) + 0x10) = 7;
                poVar10 = poVar1 + *(long *)(lVar11 + -0x18);
                if (poVar1[*(long *)(lVar11 + -0x18) + 0xe1] == (ostream)0x0) {
                  oVar5 = (ostream)std::ios::widen((char)poVar10);
                  poVar10[0xe0] = oVar5;
                  poVar10[0xe1] = (ostream)0x1;
                }
                poVar10[0xe0] = (ostream)0x30;
                poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
                *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) =
                     *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) & 0xffffffb5 |
                     2;
                if ((int)local_88 != 0) {
                  std::__ostream_insert<char,std::char_traits<char>>(this->outStr,"*",1);
                }
                std::__ostream_insert<char,std::char_traits<char>>(this->outStr,")",1);
              }
LAB_0010bca4:
              cVar2 = (char)this->outStr;
              std::ios::widen((char)*(undefined8 *)(*(long *)this->outStr + -0x18) + cVar2);
              std::ostream::put(cVar2);
              std::ostream::flush();
              if (this->Node2Board[uVar18] < 0x10) {
                poVar10 = this->outStr;
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,"    Duplicate entry, previous value = ",0x26);
                plVar13 = (long *)std::ostream::operator<<
                                            ((ostream *)poVar10,(uint)this->Node2Board[uVar18]);
                std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
                std::ostream::put((char)plVar13);
                std::ostream::flush();
              }
              local_78[uVar18] = (uchar)local_80;
              if (uVar3 < 4) {
                this->IsAllBoardsBroadcastCapable_ = false;
                this->IsAllBoardsRev4_5_ = false;
                this->IsAllBoardsRev4_6_ = false;
              }
              if (5 < uVar3) {
                this->IsAllBoardsRev4_5_ = false;
              }
              if (6 < uVar3) {
                this->IsAllBoardsRev4_6_ = false;
              }
              if ((uVar3 == 6) || (this->IsAllBoardsRev6_ = false, uVar3 != 7)) {
                this->IsAllBoardsRev7_ = false;
              }
              if (uVar3 - 10 < 0xfffffffe) {
                this->IsAllBoardsRev8_9_ = false;
              }
              this->NumOfNodes_ = this->NumOfNodes_ + 1;
              goto LAB_0010bd8a;
            }
            poVar10 = this->outStr;
            lVar11 = 0x35;
            pcVar15 = "BasePort::ScanNodes: unable to read status from node ";
          }
          else {
            iVar7 = (*this->_vptr_BasePort[4])(this,uVar18 & 0xffff,0xc,&local_94);
            if ((char)iVar7 != '\0') {
              uVar8 = BoardIO::GetFpgaVersionMajorFromStatus(local_94);
              goto LAB_0010b823;
            }
            poVar10 = this->outStr;
            lVar11 = 0x48;
            pcVar15 = "BasePort::ScanNodes: unable to read FPGA version (ETH_STATUS) from node ";
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar15,lVar11);
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
        }
      }
LAB_0010bd8a:
      uVar18 = uVar18 + 1;
    } while (uVar18 != (uVar6 & 0xffff));
  }
  poVar10 = this->outStr;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"BasePort::ScanNodes: found ",0x1b);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," boards",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  uVar18 = 0;
  puVar14 = local_78;
  do {
    this->Board2Node[uVar18] = 0x40;
    if (local_8a != 0) {
      uVar17 = 0;
      do {
        if (uVar18 == puVar14[uVar17]) {
          if (this->Board2Node[uVar18] < 0x40) {
            poVar10 = this->outStr;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,"BasePort::ScanNodes: warning: duplicate node id for board ",0x3a);
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(",1);
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            puVar14 = local_78;
          }
          this->Board2Node[uVar18] = (nodeid_t)uVar17;
        }
        uVar17 = uVar17 + 1;
      } while ((uVar6 & 0xffff) != uVar17);
    }
    uVar18 = uVar18 + 1;
  } while (uVar18 != 0x10);
  return this->NumOfNodes_ != 0;
}

Assistant:

bool BasePort::ScanNodes(void)
{
    unsigned int board;
    nodeid_t node;

    // Clear any existing Node2Board
    memset(Node2Board, BoardIO::MAX_BOARDS, sizeof(Node2Board));

    IsAllBoardsBroadcastCapable_ = true;
    IsAllBoardsRev4_5_ = true;
    IsAllBoardsRev4_6_ = true;
    IsAllBoardsRev6_ = true;
    IsAllBoardsRev7_ = true;
    IsAllBoardsRev8_9_ = true;
    NumOfNodes_ = 0;

    nodeid_t max_nodes = InitNodes();

    outStr << "BasePort::ScanNodes: building node map for " << max_nodes << " nodes:" << std::endl;
    // Iterate through all possible nodes
    for (node = 0; node < max_nodes; node++) {
        quadlet_t data;
        unsigned long hver = 0;
        // check hardware version
        if (!ReadQuadletNode(node, BoardIO::HARDWARE_VERSION, data)) {
            if (GetPortType() == PORT_FIREWIRE)
                outStr << "BasePort::ScanNodes: unable to read from node " << node << std::endl;
            continue;
        }
        hver = data;

        if (!HardwareVersionValid(hver)) {
            outStr << "BasePort::ScanNodes: node " << node << " is not a supported board (data = "
                   << std::hex << data << std::dec << ")" << std::endl;
            continue;
        }

        // read firmware version
        unsigned long fver = 0;
        if (!ReadQuadletNode(node, BoardIO::FIRMWARE_VERSION, data)) {
            outStr << "BasePort::ScanNodes: unable to read firmware version from node "
                   << node << std::endl;
            continue;
        }
        fver = data;

        // read FPGA version (for Firmware Rev 5+)
        unsigned long fpga_ver = 1;
        if (fver >= 5) {
            if (!ReadQuadletNode(node, BoardIO::ETH_STATUS, data)) {
                outStr << "BasePort::ScanNodes: unable to read FPGA version (ETH_STATUS) from node "
                       << node << std::endl;
                continue;
            }
            fpga_ver = BoardIO::GetFpgaVersionMajorFromStatus(data);
        }

        // read board id
        if (!ReadQuadletNode(node, BoardIO::BOARD_STATUS, data)) {
            outStr << "BasePort::ScanNodes: unable to read status from node " << node << std::endl;
            continue;
        }
        // board_id is bits 27-24, BOARD_ID_MASK = 0x0F000000
        board = (data & BOARD_ID_MASK) >> 24;
        FpgaVersion[board] = fpga_ver;
        HardwareVersion[board] = hver;
        FirmwareVersion[board] = fver;

        // read git description (introduced after Rev 8 release)
        uint32_t git_desc = 0;
        if (!ReadQuadletNode(node, BoardIO::GIT_DESC, git_desc)) {
            outStr << "BasePort::ScanNodes: unable to read git desc from node " << node << std::endl;
        }
        outStr << "  Node " << node << ", BoardId = " << board
               << ", " << GetFpgaVersionMajorString(board)
               << ", Hardware = " << GetHardwareVersionString(board)
               << ", Firmware Version = " << GetFirmwareVersion(board);

        if (git_desc != 0) {
            // git_dirty bit indicates that firmware was built with uncommitted changes;
            // shown by appending * to the git SHA.
            bool git_dirty = git_desc&0x00000008;
            // git_commits bit indicates whether there were any commits since the last tag
            bool git_commits = git_desc&0x00000004;
            // git_flag is set by the firmware, based on comparing the firmware version (F) to
            // the most recent git tag ("RevG", where G is the git tag version)
            //    0:  F == G     actual release ("F") or update to last release ("F+"),
            //                   depending on git_dirty and git_commits
            //    1:  F == G+1   new firmware preview, shown as "F-"
            //    2:  F > G+1    should not happen (missing git tag?), shown as "F?"
            //    3:  F < G      should not happen, shown as "F?"
            uint8_t git_flag = git_desc&0x00000003;
            bool showSHA = true;
            if (git_flag == 0) {
                if (git_dirty|git_commits)
                    outStr << "+";
                else
                    showSHA = false;
            }
            else if (git_flag == 1)
                outStr << "-";
            else
                outStr << "?";
            if (showSHA) {
                outStr << " (git-" << std::hex << std::setw(7) << std::setfill('0')
                       << (git_desc>>4) << std::dec;
                if (git_dirty)
                    outStr << "*";
                outStr << ")";
            }
        }
        outStr << std::endl;

        if (Node2Board[node] < BoardIO::MAX_BOARDS) {
            outStr << "    Duplicate entry, previous value = "
                   << static_cast<int>(Node2Board[node]) << std::endl;
        }
        Node2Board[node] = static_cast<unsigned char>(board);

        // check firmware version
        // Firmware Version >= 4, broadcast capable
        if (fver < 4) {
            IsAllBoardsBroadcastCapable_ = false;
            IsAllBoardsRev4_5_ = false;
            IsAllBoardsRev4_6_ = false;
        }
        if (fver > 5) IsAllBoardsRev4_5_ = false;
        if (fver > 6) IsAllBoardsRev4_6_ = false;
        // Firmware Version 6, broadcast with possibly shorter wait (i.e., skipping nodes
        // on the bus that are not part of the current configuration).
        if (fver != 6) IsAllBoardsRev6_ = false;
        // Firmware Version 7, added power control to block write; added velocity estimation
        // fields to block read
        if (fver != 7) IsAllBoardsRev7_ = false;
        // Firmware Version 8, added header quadlet to block write; support larger entries in
        // block read (both changes to support dRAC).
        if ((fver != 8) && (fver != 9)) IsAllBoardsRev8_9_ = false;
        NumOfNodes_++;
    }
    outStr << "BasePort::ScanNodes: found " << NumOfNodes_ << " boards" << std::endl;

    // update Board2Node
    for (board = 0; board < BoardIO::MAX_BOARDS; board++) {
        Board2Node[board] = MAX_NODES;
        // search up to max_nodes (not NumOfNodes_) in case nodes are not sequential (i.e., if some nodes
        // are not associated with valid boards).
        for (node = 0; node < max_nodes; node++) {
            if (Node2Board[node] == board) {
                if (Board2Node[board] < MAX_NODES)
                    outStr << "BasePort::ScanNodes: warning: duplicate node id for board " << board
                           << "(" << Board2Node[board] << ", " << node << ")" << std::endl;
                Board2Node[board] = node;
            }
        }
    }

    return (NumOfNodes_ > 0);
}